

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3CodeVerifySchema(Parse *pParse,int iDb)

{
  int in_ESI;
  Parse *in_RDI;
  Parse *pToplevel;
  Parse *local_20;
  
  local_20 = in_RDI;
  if (in_RDI->pToplevel != (Parse *)0x0) {
    local_20 = in_RDI->pToplevel;
  }
  if (((local_20->cookieMask & 1 << ((byte)in_ESI & 0x1f)) == 0) &&
     (local_20->cookieMask = 1 << ((byte)in_ESI & 0x1f) | local_20->cookieMask, in_ESI == 1)) {
    sqlite3OpenTempDatabase(local_20);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CodeVerifySchema(Parse *pParse, int iDb){
  Parse *pToplevel = sqlite3ParseToplevel(pParse);

  assert( iDb>=0 && iDb<pParse->db->nDb );
  assert( pParse->db->aDb[iDb].pBt!=0 || iDb==1 );
  assert( iDb<SQLITE_MAX_ATTACHED+2 );
  assert( sqlite3SchemaMutexHeld(pParse->db, iDb, 0) );
  if( DbMaskTest(pToplevel->cookieMask, iDb)==0 ){
    DbMaskSet(pToplevel->cookieMask, iDb);
    if( !OMIT_TEMPDB && iDb==1 ){
      sqlite3OpenTempDatabase(pToplevel);
    }
  }
}